

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImVec2 *lhs;
  float fVar1;
  float fVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImGuiGroupData *pIVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  ImGuiGroupData *pIVar8;
  char cVar9;
  long lVar10;
  ImGuiItemStatusFlags *pIVar11;
  bool bVar12;
  uint uVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImRect group_bb;
  ImRect local_68;
  ImVec2 local_58;
  ImGuiGroupData *local_50;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar5 = (GImGui->GroupStack).Data;
  lVar10 = (long)(GImGui->GroupStack).Size;
  local_50 = pIVar5 + lVar10;
  lhs = &(pIVar4->DC).CursorMaxPos;
  local_68.Max = ImMax(lhs,&pIVar5[lVar10 + -1].BackupCursorPos);
  local_68.Min = pIVar5[lVar10 + -1].BackupCursorPos;
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = local_68.Max.x;
  local_48._4_4_ = local_68.Max.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  (pIVar4->DC).CursorPos = local_68.Min;
  local_58 = local_68.Min;
  IVar6 = ImMax(&pIVar5[lVar10 + -1].BackupCursorMaxPos,lhs);
  pIVar8 = local_50;
  (pIVar4->DC).CursorMaxPos = IVar6;
  (pIVar4->DC).Indent.x = pIVar5[lVar10 + -1].BackupIndent.x;
  (pIVar4->DC).GroupOffset.x = pIVar5[lVar10 + -1].BackupGroupOffset.x;
  (pIVar4->DC).CurrLineSize = pIVar5[lVar10 + -1].BackupCurrLineSize;
  fVar1 = pIVar5[lVar10 + -1].BackupCurrLineTextBaseOffset;
  (pIVar4->DC).CurrLineTextBaseOffset = fVar1;
  if (pIVar7->LogEnabled == true) {
    pIVar7->LogLinePosY = -3.4028235e+38;
  }
  if (local_50[-1].EmitItem != true) goto LAB_0011d849;
  fVar2 = (pIVar4->DC).PrevLineTextBaseOffset;
  uVar13 = -(uint)(fVar1 <= fVar2);
  (pIVar4->DC).CurrLineTextBaseOffset = (float)(~uVar13 & (uint)fVar1 | (uint)fVar2 & uVar13);
  local_38.y = (float)local_48._4_4_ - local_58.y;
  local_38.x = (float)local_48._0_4_ - local_58.x;
  ItemSize(&local_38,-1.0);
  ItemAdd(&local_68,0,(ImRect *)0x0);
  IVar3 = pIVar7->ActiveId;
  if (pIVar8[-1].BackupActiveIdIsAlive == IVar3) {
    if (pIVar8[-1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar9 = pIVar7->ActiveIdPreviousFrameIsAlive;
joined_r0x0011d7ff:
      if (cVar9 == '\0') goto LAB_0011d805;
      (pIVar4->DC).LastItemId = pIVar7->ActiveIdPreviousFrame;
      cVar9 = '\x01';
    }
    else {
LAB_0011d805:
      cVar9 = '\0';
    }
LAB_0011d807:
    (pIVar4->DC).LastItemRect.Min = local_68.Min;
    (pIVar4->DC).LastItemRect.Max = local_68.Max;
    uVar13 = (pIVar4->DC).LastItemStatusFlags;
    (pIVar4->DC).LastItemStatusFlags = uVar13 | 0x20;
joined_r0x0011d7f9:
    if (cVar9 == '\0') goto LAB_0011d849;
  }
  else {
    bVar12 = pIVar7->ActiveIdIsAlive != IVar3;
    if (pIVar8[-1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar9 = pIVar7->ActiveIdPreviousFrameIsAlive;
      if (IVar3 == 0 || bVar12) goto joined_r0x0011d7ff;
    }
    else {
      cVar9 = '\0';
      if (IVar3 == 0 || bVar12) goto LAB_0011d807;
    }
    (pIVar4->DC).LastItemId = IVar3;
    (pIVar4->DC).LastItemRect.Min = local_68.Min;
    (pIVar4->DC).LastItemRect.Max = local_68.Max;
    uVar13 = (pIVar4->DC).LastItemStatusFlags;
    pIVar11 = &(pIVar4->DC).LastItemStatusFlags;
    if (pIVar7->ActiveIdHasBeenEditedThisFrame != true) {
      *pIVar11 = uVar13 | 0x20;
      goto joined_r0x0011d7f9;
    }
    *pIVar11 = uVar13 | 0x24;
    if (cVar9 == '\0') goto LAB_0011d849;
    uVar13 = uVar13 | 4;
  }
  if (pIVar7->ActiveId != pIVar7->ActiveIdPreviousFrame) {
    (pIVar4->DC).LastItemStatusFlags = uVar13 | 0x60;
  }
LAB_0011d849:
  (pIVar7->GroupStack).Size = (pIVar7->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}